

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

void bcm2835_spi_transfernb(char *tbuf,char *rbuf,uint32_t len)

{
  uint32_t *paddr;
  uint32_t *paddr_00;
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  
  paddr_00 = bcm2835_spi0;
  paddr = bcm2835_spi0 + 1;
  bcm2835_peri_set_bits(bcm2835_spi0,0x30,0x30);
  bcm2835_peri_set_bits(paddr_00,0x80,0x80);
  uVar3 = 0;
  uVar4 = 0;
  while ((uint)uVar4 < len || (uint)uVar3 < len) {
    uVar3 = uVar3 & 0xffffffff;
    while( true ) {
      uVar2 = bcm2835_peri_read(paddr_00);
      if (((uVar2 >> 0x12 & 1) == 0) || (len <= uVar3)) break;
      bVar1 = tbuf[uVar3];
      if (bcm2835_spi_bit_order == '\0') {
        bVar1 = ""[bVar1];
      }
      bcm2835_peri_write_nb(paddr,(uint)bVar1);
      uVar3 = uVar3 + 1;
    }
    uVar4 = uVar4 & 0xffffffff;
    while( true ) {
      uVar2 = bcm2835_peri_read(paddr_00);
      if (((uVar2 >> 0x11 & 1) == 0) || (len <= uVar4)) break;
      uVar2 = bcm2835_peri_read_nb(paddr);
      bVar1 = (byte)uVar2;
      if (bcm2835_spi_bit_order == '\0') {
        bVar1 = ""[bVar1];
      }
      rbuf[uVar4] = bVar1;
      uVar4 = uVar4 + 1;
    }
  }
  do {
    uVar2 = bcm2835_peri_read_nb(paddr_00);
  } while ((uVar2 >> 0x10 & 1) == 0);
  bcm2835_peri_set_bits(paddr_00,0,0x80);
  return;
}

Assistant:

void bcm2835_spi_transfernb(char* tbuf, char* rbuf, uint32_t len)
{
    volatile uint32_t* paddr = bcm2835_spi0 + BCM2835_SPI0_CS/4;
    volatile uint32_t* fifo = bcm2835_spi0 + BCM2835_SPI0_FIFO/4;
    uint32_t TXCnt=0;
    uint32_t RXCnt=0;

    /* This is Polled transfer as per section 10.6.1
    // BUG ALERT: what happens if we get interupted in this section, and someone else
    // accesses a different peripheral? 
    */

    /* Clear TX and RX fifos */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_CLEAR, BCM2835_SPI0_CS_CLEAR);

    /* Set TA = 1 */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_TA, BCM2835_SPI0_CS_TA);

    /* Use the FIFO's to reduce the interbyte times */
    while((TXCnt < len)||(RXCnt < len))
    {
        /* TX fifo not full, so add some more bytes */
        while(((bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_TXD))&&(TXCnt < len ))
        {
	    bcm2835_peri_write_nb(fifo, bcm2835_correct_order(tbuf[TXCnt]));
	    TXCnt++;
        }
        /* Rx fifo not empty, so get the next received bytes */
        while(((bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_RXD))&&( RXCnt < len ))
        {
	    rbuf[RXCnt] = bcm2835_correct_order(bcm2835_peri_read_nb(fifo));
	    RXCnt++;
        }
    }
    /* Wait for DONE to be set */
    while (!(bcm2835_peri_read_nb(paddr) & BCM2835_SPI0_CS_DONE))
	;

    /* Set TA = 0, and also set the barrier */
    bcm2835_peri_set_bits(paddr, 0, BCM2835_SPI0_CS_TA);
}